

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::SetPerViewportIsVisibleInNewDetails(ON_Layer *this,bool bVisible)

{
  bool bVar1;
  ON_LayerPrivate *this_00;
  bool bVisible_local;
  ON_Layer *this_local;
  
  bVar1 = PerViewportIsVisibleInNewDetails(this);
  if (bVar1 != bVisible) {
    if (this->m_private == (ON_LayerPrivate *)0x0) {
      this_00 = (ON_LayerPrivate *)operator_new(0x18);
      memset(this_00,0,0x18);
      ON_LayerPrivate::ON_LayerPrivate(this_00);
      this->m_private = this_00;
    }
    this->m_private->m_visible_in_new_details = bVisible;
  }
  return;
}

Assistant:

void ON_Layer::SetPerViewportIsVisibleInNewDetails(bool bVisible)
{
  if (PerViewportIsVisibleInNewDetails() == bVisible)
    return;
  if (nullptr == m_private)
    m_private = new ON_LayerPrivate();
  m_private->m_visible_in_new_details = bVisible;
}